

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_args.c
# Opt level: O3

REF_STATUS ref_args_char(REF_INT n,char **args,char *long_target,char *short_target,char **value)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  REF_INT i;
  
  *value = (char *)0x0;
  if (0 < n) {
    uVar3 = 0;
    do {
      iVar1 = strcmp(long_target,args[uVar3]);
      if (iVar1 == 0) {
        if (n + -1 <= (int)uVar3) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",
                 0x39,"ref_args_char","missing value");
          short_target = long_target;
          goto LAB_0010df01;
        }
        pcVar2 = args[uVar3 + 1];
        goto LAB_0010dec4;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
    uVar3 = 0;
    do {
      iVar1 = strcmp(short_target,args[uVar3]);
      if (iVar1 == 0) {
        if (n + -1 <= (int)uVar3) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",
                 0x3f,"ref_args_char","missing value");
LAB_0010df01:
          printf("for option %s",short_target);
          return 1;
        }
        pcVar2 = args[uVar3 + 1];
LAB_0010dec4:
        *value = pcVar2;
        return 0;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_args_char(REF_INT n, char **args,
                                 const char *long_target,
                                 const char *short_target, char **value) {
  REF_INT pos;
  *value = NULL;
  if (REF_SUCCESS == ref_args_find(n, args, long_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", long_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS == ref_args_find(n, args, short_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", short_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  return REF_NOT_FOUND;
}